

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_Bignum256.c
# Opt level: O3

uint64_t Hacl_Bignum256_add(uint64_t *a,uint64_t *b,uint64_t *res)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar1 = *a;
  uVar2 = *b;
  *res = uVar1 + *b;
  uVar3 = a[1];
  uVar4 = (ulong)CARRY8(uVar1,uVar2);
  uVar1 = b[1];
  uVar5 = uVar3 + b[1];
  res[1] = uVar5 + uVar4;
  uVar2 = a[2];
  uVar4 = (ulong)(CARRY8(uVar3,uVar1) || CARRY8(uVar5,uVar4));
  uVar1 = b[2];
  uVar5 = uVar2 + b[2];
  res[2] = uVar5 + uVar4;
  uVar3 = a[3];
  uVar2 = (ulong)(CARRY8(uVar2,uVar1) || CARRY8(uVar5,uVar4));
  uVar1 = b[3];
  uVar4 = uVar3 + b[3];
  res[3] = uVar4 + uVar2;
  return (ulong)(CARRY8(uVar3,uVar1) || CARRY8(uVar4,uVar2));
}

Assistant:

uint64_t Hacl_Bignum256_add(uint64_t *a, uint64_t *b, uint64_t *res)
{
  uint64_t c = 0ULL;
  {
    uint64_t t1 = a[4U * 0U];
    uint64_t t20 = b[4U * 0U];
    uint64_t *res_i0 = res + 4U * 0U;
    c = Lib_IntTypes_Intrinsics_add_carry_u64(c, t1, t20, res_i0);
    uint64_t t10 = a[4U * 0U + 1U];
    uint64_t t21 = b[4U * 0U + 1U];
    uint64_t *res_i1 = res + 4U * 0U + 1U;
    c = Lib_IntTypes_Intrinsics_add_carry_u64(c, t10, t21, res_i1);
    uint64_t t11 = a[4U * 0U + 2U];
    uint64_t t22 = b[4U * 0U + 2U];
    uint64_t *res_i2 = res + 4U * 0U + 2U;
    c = Lib_IntTypes_Intrinsics_add_carry_u64(c, t11, t22, res_i2);
    uint64_t t12 = a[4U * 0U + 3U];
    uint64_t t2 = b[4U * 0U + 3U];
    uint64_t *res_i = res + 4U * 0U + 3U;
    c = Lib_IntTypes_Intrinsics_add_carry_u64(c, t12, t2, res_i);
  }
  return c;
}